

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<Fad<double>_>::TPZVec(TPZVec<Fad<double>_> *this,int64_t size,Fad<double> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  Fad<double> *pFVar4;
  ulong in_RSI;
  undefined8 *in_RDI;
  ulong uVar5;
  int64_t i;
  Fad<double> *in_stack_ffffffffffffff78;
  Fad<double> *in_stack_ffffffffffffff80;
  Fad<double> *local_60;
  long local_30;
  
  *in_RDI = &PTR__TPZVec_023e05f8;
  in_RDI[1] = 0;
  if ((long)in_RSI < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<Fad<double>>::TPZVec(const int64_t, const T &) [TVar = Fad<double>]");
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    in_RDI[2] = 0;
    in_RDI[3] = 0;
  }
  else {
    if (in_RSI != 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      uVar2 = SUB168(auVar1 * ZEXT816(0x20),0);
      uVar5 = uVar2 + 8;
      if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar2) {
        uVar5 = 0xffffffffffffffff;
      }
      puVar3 = (ulong *)operator_new__(uVar5);
      *puVar3 = in_RSI;
      pFVar4 = (Fad<double> *)(puVar3 + 1);
      if (in_RSI != 0) {
        local_60 = pFVar4;
        do {
          Fad<double>::Fad(local_60);
          local_60 = local_60 + 1;
        } while (local_60 != pFVar4 + in_RSI);
      }
      in_RDI[1] = pFVar4;
    }
    in_RDI[2] = in_RSI;
    in_RDI[3] = in_RSI;
    for (local_30 = 0; local_30 < (long)in_RSI; local_30 = local_30 + 1) {
      Fad<double>::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}